

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::growGlobalUniformBlock
          (TParseContext *this,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *typeList)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TVariable *pTVar3;
  TIntermediate *pTVar4;
  int iVar5;
  TBlockStorageClass newBacking;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *this_00;
  undefined4 extraout_var_01;
  
  pTVar3 = (this->super_TParseContextBase).globalUniformBlock;
  if (pTVar3 == (TVariable *)0x0) {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    uVar1 = pTVar4->globalUniformBlockSet;
    uVar2 = pTVar4->globalUniformBlockBinding;
    (this->super_TParseContextBase).globalUniformBinding = uVar2;
    (this->super_TParseContextBase).globalUniformSet = uVar1;
  }
  TParseContextBase::growGlobalUniformBlock
            (&this->super_TParseContextBase,loc,memberType,memberName,typeList);
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == true)) {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x45])(this)
    ;
    newBacking = TIntermediate::getBlockStorageOverride(pTVar4,(char *)CONCAT44(extraout_var,iVar5))
    ;
    iVar5 = (*(((this->super_TParseContextBase).globalUniformBlock)->super_TSymbol)._vptr_TSymbol
              [0xd])();
    this_00 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x50))
                        ((long *)CONCAT44(extraout_var_00,iVar5));
    this_00->field_0xc = this_00->field_0xc | 8;
    if (newBacking != EbsNone) {
      if (pTVar3 == (TVariable *)0x0) {
        TQualifier::setBlockStorage(this_00,newBacking);
        blockQualifierCheck(this,loc,this_00,false);
      }
      iVar5 = (*memberType->_vptr_TType[10])(memberType);
      TQualifier::setBlockStorage((TQualifier *)CONCAT44(extraout_var_01,iVar5),newBacking);
      return;
    }
  }
  return;
}

Assistant:

void TParseContext::growGlobalUniformBlock(const TSourceLoc& loc, TType& memberType, const TString& memberName, TTypeList* typeList)
{
    bool createBlock = globalUniformBlock == nullptr;

    if (createBlock) {
        globalUniformBinding = intermediate.getGlobalUniformBinding();
        globalUniformSet = intermediate.getGlobalUniformSet();
    }

    // use base class function to create/expand block
    TParseContextBase::growGlobalUniformBlock(loc, memberType, memberName, typeList);

    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        // check for a block storage override
        TBlockStorageClass storageOverride = intermediate.getBlockStorageOverride(getGlobalUniformBlockName());
        TQualifier& qualifier = globalUniformBlock->getWritableType().getQualifier();
        qualifier.defaultBlock = true;

        if (storageOverride != EbsNone) {
            if (createBlock) {
                // Remap block storage
                qualifier.setBlockStorage(storageOverride);

                // check that the change didn't create errors
                blockQualifierCheck(loc, qualifier, false);
            }

            // remap meber storage as well
            memberType.getQualifier().setBlockStorage(storageOverride);
        }
    }
}